

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O1

bool __thiscall Assimp::AMFImporter::XML_ReadNode_GetAttrVal_AsBool(AMFImporter *this,int pAttrIdx)

{
  int iVar1;
  undefined4 extraout_var;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  bool bVar4;
  undefined4 in_register_00000034;
  string val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[6])
                    (this->mReader,CONCAT44(in_register_00000034,pAttrIdx));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,(char *)CONCAT44(extraout_var,iVar1),(allocator<char> *)&local_60);
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_80);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&local_80);
      bVar4 = true;
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)&local_80);
        if (iVar1 != 0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_40,
                         "Bool attribute value can contain \"false\"/\"0\" or \"true\"/\"1\" not the \""
                         ,&local_80);
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
          local_60 = (long *)*plVar2;
          plVar3 = plVar2 + 2;
          if (local_60 == plVar3) {
            local_50 = *plVar3;
            lStack_48 = plVar2[3];
            local_60 = &local_50;
          }
          else {
            local_50 = *plVar3;
          }
          local_58 = plVar2[1];
          *plVar2 = (long)plVar3;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::runtime_error::runtime_error(this_00,(string *)&local_60);
          *(undefined ***)this_00 = &PTR__runtime_error_007fa260;
          __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      goto LAB_003de477;
    }
  }
  bVar4 = false;
LAB_003de477:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool AMFImporter::XML_ReadNode_GetAttrVal_AsBool(const int pAttrIdx)
{
    std::string val(mReader->getAttributeValue(pAttrIdx));

	if((val == "false") || (val == "0"))
		return false;
	else if((val == "true") || (val == "1"))
		return true;
	else
		throw DeadlyImportError("Bool attribute value can contain \"false\"/\"0\" or \"true\"/\"1\" not the \"" + val + "\"");
}